

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySamplingTest::textureDefinition::setupImage
          (textureDefinition *this,GLuint image_unit,GLenum internal_format)

{
  GLenum err;
  InternalError *this_00;
  GLenum internal_format_local;
  GLuint image_unit_local;
  textureDefinition *this_local;
  
  if ((this->m_gl != (Functions *)0x0) && (this->m_texture_object_id != 0xffffffff)) {
    (*this->m_gl->bindImageTexture)
              (image_unit,this->m_texture_object_id,0,'\0',0,0x88b9,internal_format);
    err = (*this->m_gl->getError)();
    glu::checkError(err,"glBindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0x137b);
    return;
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,"Not initialized textureDefinition","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
             ,0x1376);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

void TextureCubeMapArraySamplingTest::textureDefinition::setupImage(glw::GLuint image_unit, glw::GLenum internal_format)
{
	if ((0 == m_gl) || (m_invalid_texture_object_id == m_texture_object_id))
	{
		throw tcu::InternalError("Not initialized textureDefinition", "", __FILE__, __LINE__);
	}

	m_gl->bindImageTexture(image_unit, m_texture_object_id, 0, GL_FALSE, 0, GL_WRITE_ONLY, internal_format);

	GLU_EXPECT_NO_ERROR(m_gl->getError(), "glBindImageTexture");
}